

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O1

void pzshape::TPZShapeCube::SideShapeOrder
               (int side,TPZVec<long> *id,int order,TPZGenMatrix<int> *shapeorders)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int b;
  int a;
  int c;
  int iVar4;
  ulong uVar5;
  ulong i;
  uint uVar6;
  long lVar7;
  bool bVar8;
  TPZManVector<long,_4> locid;
  TPZGenMatrix<int> locshapeorders;
  TPZStack<int,_10> lowersides;
  TPZManVector<long,_4> local_d0;
  TPZGenMatrix<int> local_90;
  TPZManVector<int,_10> local_78;
  
  if (side < 8) {
    if (shapeorders->fRows != 1) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapecube.cpp"
                 ,0x17b);
    }
    piVar3 = TPZGenMatrix<int>::operator()(shapeorders,0,0);
    *piVar3 = 1;
    piVar3 = TPZGenMatrix<int>::operator()(shapeorders,0,1);
    *piVar3 = 0;
    piVar3 = TPZGenMatrix<int>::operator()(shapeorders,0,2);
    *piVar3 = 0;
  }
  else if (side == 0x1a) {
    iVar1 = order + -1;
    if (shapeorders->fRows != (long)(iVar1 * iVar1 * iVar1)) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapecube.cpp"
                 ,0x185);
    }
    if (1 < order) {
      lVar7 = 0;
      iVar1 = 2;
      do {
        iVar2 = 2;
        do {
          lVar7 = (long)(int)lVar7;
          iVar4 = 2;
          do {
            piVar3 = TPZGenMatrix<int>::operator()(shapeorders,lVar7,0);
            *piVar3 = iVar1;
            piVar3 = TPZGenMatrix<int>::operator()(shapeorders,lVar7,1);
            *piVar3 = iVar2;
            piVar3 = TPZGenMatrix<int>::operator()(shapeorders,lVar7,2);
            *piVar3 = iVar4;
            lVar7 = lVar7 + 1;
            bVar8 = iVar4 != order;
            iVar4 = iVar4 + 1;
          } while (bVar8);
          bVar8 = iVar2 != order;
          iVar2 = iVar2 + 1;
        } while (bVar8);
        bVar8 = iVar1 != order;
        iVar1 = iVar1 + 1;
      } while (bVar8);
    }
  }
  else if (side < 0x14) {
    if (shapeorders->fRows != (long)(int)(order - 1U)) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapecube.cpp"
                 ,0x19d);
    }
    if (1 < order) {
      uVar5 = 0;
      do {
        piVar3 = TPZGenMatrix<int>::operator()(shapeorders,uVar5,0);
        *piVar3 = (int)uVar5 + 2;
        uVar5 = uVar5 + 1;
      } while (order - 1U != uVar5);
    }
  }
  else {
    iVar1 = order + -1;
    uVar6 = iVar1 * iVar1;
    if (shapeorders->fRows != (ulong)uVar6) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapecube.cpp"
                 ,0x1a9);
    }
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
    pztopology::TPZCube::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_78);
    TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,side);
    iVar2 = pztopology::TPZCube::NSideNodes(side);
    TPZManVector<long,_4>::TPZManVector(&local_d0,(long)iVar2);
    if (0 < local_d0.super_TPZVec<long>.fNElements) {
      lVar7 = 0;
      do {
        iVar2 = pztopology::TPZCube::ContainedSideLocId(side,(int)lVar7);
        local_d0.super_TPZVec<long>.fStore[lVar7] = id->fStore[iVar2];
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_d0.super_TPZVec<long>.fNElements);
    }
    TPZGenMatrix<int>::TPZGenMatrix(&local_90,(ulong)uVar6,3);
    TPZShapeQuad::SideShapeOrder(8,&local_d0.super_TPZVec<long>,order,&local_90);
    if (iVar1 != 0) {
      uVar5 = 1;
      if (1 < uVar6) {
        uVar5 = (ulong)uVar6;
      }
      i = 0;
      do {
        piVar3 = TPZGenMatrix<int>::operator()(&local_90,i,0);
        iVar1 = *piVar3;
        piVar3 = TPZGenMatrix<int>::operator()(shapeorders,i,0);
        *piVar3 = iVar1;
        piVar3 = TPZGenMatrix<int>::operator()(&local_90,i,1);
        iVar1 = *piVar3;
        piVar3 = TPZGenMatrix<int>::operator()(shapeorders,i,1);
        *piVar3 = iVar1;
        piVar3 = TPZGenMatrix<int>::operator()(&local_90,i,2);
        iVar1 = *piVar3;
        piVar3 = TPZGenMatrix<int>::operator()(shapeorders,i,2);
        *piVar3 = iVar1;
        i = i + 1;
      } while (uVar5 != i);
    }
    TPZGenMatrix<int>::~TPZGenMatrix(&local_90);
    if (local_d0.super_TPZVec<long>.fStore == local_d0.fExtAlloc) {
      local_d0.super_TPZVec<long>.fStore = (long *)0x0;
    }
    local_d0.super_TPZVec<long>.fNAlloc = 0;
    local_d0.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
    if (local_d0.super_TPZVec<long>.fStore != (long *)0x0) {
      operator_delete__(local_d0.super_TPZVec<long>.fStore);
    }
    TPZManVector<int,_10>::~TPZManVector(&local_78);
  }
  return;
}

Assistant:

void TPZShapeCube::SideShapeOrder(const int side,  const TPZVec<int64_t> &id, const int order, TPZGenMatrix<int> &shapeorders)
    {
        //DebugStop();
        if (side<=7)
        {
            if (shapeorders.Rows() != 1)
            {
                DebugStop();
            }
            shapeorders(0,0) = 1;
            shapeorders(0,1) = 0;
            shapeorders(0,2) = 0;
        }
        else if (side == 26)
        {
            int nsei = (order-1)*(order-1)*(order-1);
            if (shapeorders.Rows() != nsei) {
                DebugStop();
            }
            int count = 0;
            for (int i=2; i<order+1; i++) {
                for (int j=2; j<order+1; j++) {
                    for (int k=2; k<order+1; k++) {
                        int a = i;
                        int b = j;
                        int c = k;
                        shapeorders(count,0) = a;
                        shapeorders(count,1) = b;
                        shapeorders(count,2) = c;
                        count++;

                    }
                    
                }
            }
        }
        else if (side>7 && side<20)
        {
            int nshape = order-1;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            for (int ioy = 0; ioy < order-1; ioy++)
            {
                shapeorders(ioy,0) = ioy+2;
            }
        }
        else
        {

            if (shapeorders.Rows() != (order-1)*(order-1))
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            //TPZVec<int> locsideorder(lowersides.size(),order);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];// SideNodeLocId( side, node);
            }// sera que esta pegando os ids corretos mesmo? 
            
            int nshape = (order-1)*(order-1);
            TPZGenMatrix<int> locshapeorders(nshape,3);

            
            TPZShapeQuad::SideShapeOrder(8,locid, order, locshapeorders);
            
            // temos que arrumar a saida de locshapeorders para adequar a orientacao dos vetores que geram
            // a face do lado side
            
            // aqui o locshapeorders esta armazenado so para x e y
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }
           
        }

    }